

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

optional<unsigned_long> __thiscall kratos::Simulator::get_value_(Simulator *this,Var *var)

{
  type tVar1;
  type_conflict1 tVar2;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar3;
  VarType VVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  size_type sVar9;
  const_reference pvVar10;
  InternalException *pIVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference pvVar12;
  undefined4 extraout_var;
  _Storage<unsigned_long,_true> args;
  unsigned_long *puVar13;
  mapped_type *__x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *this_01;
  pointer ppVar14;
  element_type *var_00;
  mapped_type *__t;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  char (*format_str) [28];
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  optional<unsigned_long> oVar16;
  string_view format_str_00;
  format_args args_00;
  bool local_3d9;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false> local_310;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false> local_308;
  uint32_t local_2fc;
  _Storage<unsigned_long,_true> local_2f8;
  optional<unsigned_long> v;
  undefined1 local_2e0 [8];
  shared_ptr<kratos::Var> arg;
  string local_2c8;
  FunctionStmtBlock *local_2a8;
  FunctionStmtBlock *def;
  FunctionCallVar *func_call_car;
  ulong local_290;
  value_type value;
  uint high;
  uint low;
  uint base;
  uint *local_258;
  type *var_low;
  type *var_high;
  undefined1 local_238 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_218;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_210;
  unsigned_long local_208;
  iterator local_200;
  undefined8 local_1f8;
  _Storage<unsigned_long,_true> local_1e8;
  optional<unsigned_long> value_2;
  v7 local_1b8 [32];
  string local_198;
  _Storage<unsigned_long,_true> local_178;
  optional<unsigned_long> value_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  Var *root;
  undefined1 local_140 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  FunctionCallVar *local_c8;
  Const *const_;
  FunctionCallVar *local_b8;
  Param *param;
  FunctionCallVar *local_a8;
  Var *var_local;
  Simulator *this_local;
  bool local_90;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_88;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a8 = (FunctionCallVar *)var;
  var_local = (Var *)this;
  if (var == (Var *)0x0) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
    uVar15 = extraout_RDX;
    goto LAB_0036b7ea;
  }
  pvVar8 = Var::size(var);
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
  if (sVar9 == 1) {
    pvVar8 = Var::size(&local_a8->super_Var);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar8);
    if (*pvVar10 < 2) {
      VVar4 = Var::type(&local_a8->super_Var);
      if (VVar4 == Parameter) {
        local_b8 = local_a8;
        const_ = (Const *)Const::value((Const *)local_a8);
        std::optional<unsigned_long>::optional<long,_true>
                  ((optional<unsigned_long> *)&this_local,(long *)&const_);
        uVar15 = extraout_RDX_01;
        goto LAB_0036b7ea;
      }
      VVar4 = Var::type(&local_a8->super_Var);
      if (VVar4 == ConstValue) {
        local_c8 = local_a8;
        bVar3 = Const::is_bignum((Const *)local_a8);
        if (bVar3) {
          pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
          (*(local_c8->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_108);
          std::operator+(&local_e8,"Big number evaluation not supported. Got ",&local_108);
          InternalException::InternalException(pIVar11,&local_e8);
          __cxa_throw(pIVar11,&InternalException::typeinfo,InternalException::~InternalException);
        }
        result.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _24_8_ = Const::value((Const *)local_c8);
        std::optional<unsigned_long>::optional<long,_true>
                  ((optional<unsigned_long> *)&this_local,
                   (long *)&result.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_engaged);
        uVar15 = extraout_RDX_02;
        goto LAB_0036b7ea;
      }
      VVar4 = Var::type(&local_a8->super_Var);
      if (VVar4 == Expression) {
        eval_expr((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_140
                  ,this,&local_a8->super_Var);
        bVar3 = std::optional::operator_cast_to_bool((optional *)local_140);
        if (bVar3) {
          this_00 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                    operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)local_140);
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (this_00,0);
          std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                    ((optional<unsigned_long> *)&this_local,pvVar12);
        }
        else {
          std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
        }
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
                  ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                   local_140);
        uVar15 = extraout_RDX_03;
        goto LAB_0036b7ea;
      }
      VVar4 = Var::type(&local_a8->super_Var);
      if (VVar4 != Slice) {
        uVar6 = (*(local_a8->super_Var).super_IRNode._vptr_IRNode[0x1c])();
        if ((uVar6 & 1) == 0) {
          local_308._M_cur =
               (__node_type *)
               std::
               unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
               ::find(&this->values_,(key_type *)&local_a8);
          local_310._M_cur =
               (__node_type *)
               std::
               unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
               ::end(&this->values_);
          bVar3 = std::__detail::operator==(&local_308,&local_310);
          if (bVar3) {
            std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
            uVar15 = extraout_RDX_07;
          }
          else {
            __t = std::
                  unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                  ::at(&this->values_,(key_type *)&local_a8);
            std::optional<unsigned_long>::optional<const_unsigned_long_&,_true>
                      ((optional<unsigned_long> *)&this_local,__t);
            uVar15 = extraout_RDX_08;
          }
        }
        else {
          def = (FunctionStmtBlock *)local_a8;
          local_2a8 = FunctionCallVar::func(local_a8);
          uVar6 = (*(local_2a8->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
          arg.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
               0;
          local_3d9 = false;
          if ((uVar6 & 1) != 0) {
            FunctionStmtBlock::function_name_abi_cxx11_(&local_2c8,local_2a8);
            arg.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
                 = 1;
            local_3d9 = std::operator==(&local_2c8,"clog2");
          }
          if ((arg.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _7_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2c8);
          }
          if (local_3d9 != false) {
            this_01 = FunctionCallVar::args_abi_cxx11_((FunctionCallVar *)def);
            v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_ =
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                 ::begin(this_01);
            ppVar14 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
                      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
                                    *)&v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                       super__Optional_payload_base<unsigned_long>._M_engaged);
            std::shared_ptr<kratos::Var>::shared_ptr
                      ((shared_ptr<kratos::Var> *)local_2e0,&ppVar14->second);
            var_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_2e0);
            oVar16 = get_value_(this,var_00);
            local_2f8._M_value =
                 oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
            v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
                 oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_engaged;
            bVar3 = std::optional::operator_cast_to_bool((optional *)&local_2f8);
            if (bVar3) {
              puVar13 = std::optional<unsigned_long>::operator*
                                  ((optional<unsigned_long> *)&local_2f8);
              local_2fc = clog2((uint32_t)*puVar13);
              std::optional<unsigned_long>::optional<unsigned_int,_true>
                        ((optional<unsigned_long> *)&this_local,&local_2fc);
            }
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_2e0);
            uVar15 = extraout_RDX_05;
            if (bVar3) goto LAB_0036b7ea;
          }
          std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
          uVar15 = extraout_RDX_06;
        }
        goto LAB_0036b7ea;
      }
      iVar5 = (*(local_a8->super_Var).super_IRNode._vptr_IRNode[0x28])();
      values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar5);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &value_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged);
      VVar4 = Var::type((Var *)values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((VVar4 == ConstValue) ||
         (VVar4 = Var::type((Var *)values.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage),
         VVar4 == Parameter)) {
        oVar16 = get_value_(this,&local_a8->super_Var);
        args._M_value =
             oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        value_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
             oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        local_178._M_value = args._M_value;
        bVar3 = std::optional::operator_cast_to_bool((optional *)&local_178);
        if (!bVar3) {
          pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
          (*(local_a8->super_Var).super_IRNode._vptr_IRNode[0x20])(local_1b8);
          local_38 = &local_198;
          local_40 = "Unable to get value for {0}";
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1b8;
          local_68.named_args.data =
               (named_arg_info<char> *)
               fmt::v7::make_args_checked<std::__cxx11::string,char[28],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"Unable to get value for {0}",(v7 *)vargs,format_str,
                          (remove_reference_t<std::__cxx11::basic_string<char>_> *)args);
          local_50 = &local_68;
          local_78 = fmt::v7::to_string_view<char,_0>(local_40);
          local_28 = &local_88;
          local_30 = local_50;
          local_20 = local_50;
          local_10 = local_50;
          local_18 = local_28;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_28,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_50->string);
          format_str_00.size_ = local_88.desc_;
          format_str_00.data_ = (char *)local_78.size_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_88.field_1.values_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_198,(detail *)local_78.data_,format_str_00,args_00);
          InternalException::InternalException(pIVar11,&local_198);
          __cxa_throw(pIVar11,&InternalException::typeinfo,InternalException::~InternalException);
        }
        puVar13 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_178);
        value_2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = *puVar13;
        __l_00._M_len = 1;
        __l_00._M_array =
             (iterator)
             &value_2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &value_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged,__l_00);
LAB_0036b1fb:
        get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)local_238,this,&local_a8->super_Var);
        bVar3 = std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::empty((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)local_238);
        if (bVar3) {
          std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
        }
        else {
          register0x00000000 =
               compute_var_high_low
                         ((Var *)values.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           *)local_238);
          var_low = std::get<0ul,unsigned_int,unsigned_int>
                              ((pair<unsigned_int,_unsigned_int> *)((long)&var_high + 4));
          local_258 = std::get<1ul,unsigned_int,unsigned_int>
                                ((pair<unsigned_int,_unsigned_int> *)((long)&var_high + 4));
          tVar1 = *var_low;
          tVar2 = *local_258;
          uVar6 = (**(code **)(*values.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 0x38))();
          if (uVar6 < (tVar1 - tVar2) + 1) {
            low._2_1_ = 1;
            pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&base,"Unable to resolve variable slicing",
                       (allocator<char> *)((long)&low + 3));
            InternalException::InternalException(pIVar11,(string *)&base);
            low._2_1_ = 0;
            __cxa_throw(pIVar11,&InternalException::typeinfo,InternalException::~InternalException);
          }
          uVar6 = *local_258;
          uVar7 = Var::var_width((Var *)values.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          high = uVar6 / uVar7;
          uVar6 = *local_258;
          uVar7 = Var::var_width((Var *)values.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          value._4_4_ = uVar6 % uVar7;
          uVar6 = *var_low;
          uVar7 = Var::var_width((Var *)values.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          value._0_4_ = uVar6 % uVar7;
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &value_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                super__Optional_payload_base<unsigned_long>._M_engaged,(ulong)high);
          local_290 = *pvVar12;
          func_call_car =
               (FunctionCallVar *)
               (local_290 >> ((byte)value._4_4_ & 0x3f) &
               (-1L << ((char)(uint)value + 1U & 0x3f) ^ 0xffffffffffffffffU));
          std::optional<unsigned_long>::optional<unsigned_long,_true>
                    ((optional<unsigned_long> *)&this_local,(unsigned_long *)&func_call_car);
        }
        std::
        vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_238);
      }
      else {
        pvVar8 = Var::size((Var *)values.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
        if (sVar9 == 1) {
          pvVar8 = Var::size((Var *)values.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar8);
          if (*pvVar10 != 1) goto LAB_0036b147;
          oVar16 = get_value_(this,(Var *)values.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_1e8._M_value =
               oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          value_2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
               oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
          bVar3 = std::optional::operator_cast_to_bool((optional *)&local_1e8);
          if (bVar3) {
            puVar13 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_1e8)
            ;
            local_208 = *puVar13;
            local_200 = &local_208;
            local_1f8 = 1;
            __l._M_len = 1;
            __l._M_array = local_200;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &value_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged,__l);
            goto LAB_0036b1fb;
          }
          std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
        }
        else {
LAB_0036b147:
          local_210._M_cur =
               (__node_type *)
               std::
               unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::find(&this->complex_values_,
                      (key_type *)
                      &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_218._M_cur =
               (__node_type *)
               std::
               unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::end(&this->complex_values_);
          bVar3 = std::__detail::operator==(&local_210,&local_218);
          if (!bVar3) {
            __x = std::
                  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::at(&this->complex_values_,
                       (key_type *)
                       &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &value_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged,__x);
            goto LAB_0036b1fb;
          }
          std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &value_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged);
      uVar15 = extraout_RDX_04;
      goto LAB_0036b7ea;
    }
  }
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
  uVar15 = extraout_RDX_00;
LAB_0036b7ea:
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar15 >> 8);
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_90;
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Simulator::get_value_(const kratos::Var *var) const {
    if (!var) return std::nullopt;
    // only scalar
    if (var->size().size() != 1 || var->size().front() > 1) return std::nullopt;

    if (var->type() == VarType::Parameter) {
        auto const *param = reinterpret_cast<const Param *>(var);
        return param->value();
    } else if (var->type() == VarType::ConstValue) {
        auto const *const_ = reinterpret_cast<const Const *>(var);
        if (const_->is_bignum())
            throw InternalException("Big number evaluation not supported. Got " +
                                    const_->to_string());
        return const_->value();
    } else if (var->type() == VarType::Expression) {
        auto result = eval_expr(var);
        if (result) {
            return (*result)[0];
        } else {
            return std::nullopt;
        }
    } else if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        std::vector<uint64_t> values;
        if (root->type() == VarType::ConstValue || root->type() == VarType::Parameter) {
            auto value = get_value_(var);
            if (!value)
                throw InternalException(
                    ::format("Unable to get value for {0}", var->handle_name()));
            values = {*value};
        } else if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            auto value = get_value_(root);
            if (!value) return std::nullopt;
            values = {*value};
        } else if (complex_values_.find(root) == complex_values_.end()) {
            return std::nullopt;
        } else {
            values = complex_values_.at(root);
        }
        // obtain the index
        auto index = get_slice_index(var);
        if (index.empty()) return std::nullopt;
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_high + 1 - var_low > root->width())
            throw InternalException("Unable to resolve variable slicing");
        auto base = var_low / root->var_width();
        auto low = var_low % root->var_width();
        auto high = var_high % root->var_width();
        auto value = values[base];
        return (value >> low) & (~(0xFFFFFFFFFFFFFFFF << (high + 1)));
    } else {
        // function call
        if (var->is_function()) {
            // only built-in function that can be statically evaluated is supported
            auto const *func_call_car = reinterpret_cast<const FunctionCallVar *>(var);
            auto *def = func_call_car->func();
            if (def->is_builtin() && def->function_name() == "clog2") {
                auto arg = func_call_car->args().begin()->second;
                auto v = get_value_(arg.get());
                if (v) return clog2(*v);
            }
            return std::nullopt;

        } else {
            if (values_.find(var) == values_.end())
                return std::nullopt;
            else
                return values_.at(var);
        }
    }
}